

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatters.h
# Opt level: O2

void __thiscall
lwlog::details::date_formatter::format(date_formatter *this,string *pattern,record_base *record)

{
  int iVar1;
  undefined4 extraout_var;
  uint32_t digit;
  uint32_t digit_00;
  uint32_t digit_01;
  string sStack_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  long lVar2;
  
  iVar1 = (*record->_vptr_record_base[2])(record);
  lVar2 = CONCAT44(extraout_var,iVar1);
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&local_38,(datetime *)(ulong)*(ushort *)(lVar2 + 8),digit);
  std::operator+(&local_b8,&local_38,'-');
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&local_d8,(datetime *)(ulong)*(byte *)(lVar2 + 10),digit_00);
  std::operator+(&local_98,&local_b8,&local_d8);
  std::operator+(&local_78,&local_98,'-');
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&sStack_f8,(datetime *)(ulong)*(byte *)(lVar2 + 0xc),digit_01);
  std::operator+(&local_58,&local_78,&sStack_f8);
  formatter::format_attribute<std::__cxx11::string>(pattern,(flag_pair *)flag::date,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_f8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void format(std::string& pattern, const record_base& record) const override
		{
			const auto& time_point{ record.time_point() };

			formatter::format_attribute(
				pattern,
				flag::date,
				os::datetime::ensure_two_digit_format(time_point.year)
					+ '-' + os::datetime::ensure_two_digit_format(time_point.month)
					+ '-' + os::datetime::ensure_two_digit_format(time_point.day)
			);
		}